

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec2<float>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Vec2<float>_> *this,OStream *os,int version)

{
  undefined8 in_RAX;
  float local_18;
  float local_14;
  
  _local_18 = CONCAT44((float)((ulong)in_RAX >> 0x20),(this->_value).x);
  (*os->_vptr_OStream[2])(os,&local_18,4);
  _local_18 = CONCAT44((this->_value).y,local_18);
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

void
V2fAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.x);
    Xdr::write <StreamIO> (os, _value.y);
}